

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CivetServer.cpp
# Opt level: O3

int CivetServer::getCookie(mg_connection *conn,string *cookieName,string *cookieValue)

{
  int iVar1;
  char *cookie_header;
  char _cookieValue [4096];
  char acStack_1018 [4096];
  
  cookie_header = mg_get_header(conn,"Cookie");
  iVar1 = mg_get_cookie(cookie_header,(cookieName->_M_dataplus)._M_p,acStack_1018,0x1000);
  cookieValue->_M_string_length = 0;
  *(cookieValue->_M_dataplus)._M_p = '\0';
  if (-1 < iVar1) {
    std::__cxx11::string::append((char *)cookieValue);
  }
  return iVar1;
}

Assistant:

int
CivetServer::getCookie(struct mg_connection *conn,
                       const std::string &cookieName,
                       std::string &cookieValue)
{
	// Maximum cookie length as per microsoft is 4096.
	// http://msdn.microsoft.com/en-us/library/ms178194.aspx
	char _cookieValue[4096];
	const char *cookie = mg_get_header(conn, "Cookie");
	int lRead = mg_get_cookie(cookie,
	                          cookieName.c_str(),
	                          _cookieValue,
	                          sizeof(_cookieValue));
	cookieValue.clear();
	if (lRead >= 0) {
		cookieValue.append(_cookieValue);
	}
	return lRead;
}